

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O1

void __thiscall
de::
SharedPtrState<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>,_de::DefaultDeleter<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>
::deletePtr(SharedPtrState<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>,_de::DefaultDeleter<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>
            *this)

{
  Move<vk::Handle<(vk::HandleType)18>_> *pMVar1;
  VkPipeline obj;
  
  pMVar1 = this->m_ptr;
  if (pMVar1 != (Move<vk::Handle<(vk::HandleType)18>_> *)0x0) {
    obj.m_internal =
         (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal;
    if (obj.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                (&(pMVar1->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter,obj);
    }
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_device = (VkDevice)0x0
    ;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal = 0;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    operator_delete(pMVar1,0x20);
  }
  this->m_ptr = (Move<vk::Handle<(vk::HandleType)18>_> *)0x0;
  return;
}

Assistant:

virtual void deletePtr (void) throw()
	{
		m_deleter(m_ptr);
		m_ptr = DE_NULL;
	}